

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hashSlow
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  void *input;
  XXH64_hash_t XVar1;
  size_t in_RDI;
  size_t size;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe0;
  
  input = (void *)byteSize(in_stack_ffffffffffffffe0);
  start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11c4b4);
  XVar1 = VELOCYPACK_XXH64(input,in_RDI,0x11c4c6);
  return XVar1;
}

Assistant:

inline uint64_t hashSlow(uint64_t seed = defaultSeed64) const {
    std::size_t const size = checkOverflow(byteSize());
    return VELOCYPACK_HASH(start(), size, seed);
  }